

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::QueryRobustAccessCase::iterate(QueryRobustAccessCase *this)

{
  ostringstream *this_00;
  glActiveTextureFunc *this_01;
  TestLog *pTVar1;
  GLenum err;
  char *description;
  bool bVar2;
  deUint8 robustAccessGL;
  RenderingContext context;
  EGLint attribList [7];
  undefined1 local_1bc8 [384];
  Functions gl;
  
  pTVar1 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  this_01 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,
                  "Check that after successfully creating a robust context the robust access query returned by glBooleanv() equals GL_TRUE\n\n"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  attribList[4] = 0x30bf;
  attribList[5] = 1;
  attribList[6] = 0x3038;
  attribList[0] = 0x3098;
  attribList[1] = 3;
  attribList[2] = 0x30fb;
  attribList[3] = 1;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,attribList);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x0;
  RenderingContext::RenderingContext
            (&context,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribList,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.activeShaderProgram);
  RenderingContext::makeCurrent(&context,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions(&gl);
  RenderingContext::initGLFunctions(&context,&gl);
  checkRequiredGLRobustnessExtension(attribList,&gl);
  (*gl.getBooleanv)(0x90f3,&robustAccessGL);
  err = (*gl.getError)();
  glu::checkError(err,"glGetBooleanv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x58a);
  bVar2 = robustAccessGL != '\x01';
  if (bVar2) {
    this_00 = (ostringstream *)(local_1bc8 + 8);
    local_1bc8._0_8_ = pTVar1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got \'");
    std::operator<<((ostream *)this_00,robustAccessGL);
    std::operator<<((ostream *)this_00,"\' expected GL_TRUE.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)bVar2,description);
  RenderingContext::~RenderingContext(&context);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check that after successfully creating a robust context the robust access query returned by glBooleanv() equals GL_TRUE\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		deUint8 robustAccessGL;
		gl.getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &robustAccessGL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv()");

		if (robustAccessGL != GL_TRUE)
		{
			log << TestLog::Message
				<< "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got '" << robustAccessGL << "' expected GL_TRUE."
				<< TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}